

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O3

void __thiscall QAccessibleButton::doAction(QAccessibleButton *this,QString *actionName)

{
  long lVar1;
  char cVar2;
  QWidget *pQVar3;
  long lVar4;
  QPushButton *this_00;
  QMenu *pQVar5;
  QAbstractButton *pQVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  
  pQVar3 = QAccessibleWidget::widget(&this->super_QAccessibleWidget);
  if ((pQVar3->data->widget_attributes & 1) != 0) {
    return;
  }
  lVar4 = QAccessibleActionInterface::pressAction();
  lVar1 = (actionName->d).size;
  if (lVar1 == *(long *)(lVar4 + 0x10)) {
    QVar7.m_data = (actionName->d).ptr;
    QVar7.m_size = lVar1;
    QVar10.m_data = *(storage_type_conflict **)(lVar4 + 8);
    QVar10.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar7,QVar10);
    if (cVar2 != '\0') goto LAB_00523683;
  }
  lVar4 = QAccessibleActionInterface::showMenuAction();
  lVar1 = (actionName->d).size;
  if (lVar1 == *(long *)(lVar4 + 0x10)) {
    QVar8.m_data = (actionName->d).ptr;
    QVar8.m_size = lVar1;
    QVar11.m_data = *(storage_type_conflict **)(lVar4 + 8);
    QVar11.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar8,QVar11);
    if (cVar2 != '\0') {
LAB_00523683:
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      this_00 = (QPushButton *)QMetaObject::cast((QObject *)&QPushButton::staticMetaObject);
      if (this_00 != (QPushButton *)0x0) {
        pQVar5 = QPushButton::menu(this_00);
        if (pQVar5 != (QMenu *)0x0) {
          QPushButton::showMenu(this_00);
          return;
        }
      }
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
      QAbstractButton::animateClick(pQVar6);
      return;
    }
  }
  lVar4 = QAccessibleActionInterface::toggleAction();
  lVar1 = (actionName->d).size;
  if (lVar1 == *(long *)(lVar4 + 0x10)) {
    QVar9.m_data = (actionName->d).ptr;
    QVar9.m_size = lVar1;
    QVar12.m_data = *(storage_type_conflict **)(lVar4 + 8);
    QVar12.m_size = lVar1;
    cVar2 = QtPrivate::equalStrings(QVar9,QVar12);
    if (cVar2 != '\0') {
      (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
      pQVar6 = (QAbstractButton *)QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
      QAbstractButton::toggle(pQVar6);
      return;
    }
  }
  QAccessibleWidget::doAction(&this->super_QAccessibleWidget,actionName);
  return;
}

Assistant:

void QAccessibleButton::doAction(const QString &actionName)
{
    if (!widget()->isEnabled())
        return;
    if (actionName == pressAction() ||
        actionName == showMenuAction()) {
#if QT_CONFIG(menu)
        QPushButton *pb = qobject_cast<QPushButton*>(object());
        if (pb && pb->menu())
            pb->showMenu();
        else
#endif
            button()->animateClick();
    } else if (actionName == toggleAction()) {
        button()->toggle();
    } else {
        QAccessibleWidget::doAction(actionName);
    }
}